

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O2

void __thiscall
btMultiBodyPoint2Point::btMultiBodyPoint2Point
          (btMultiBodyPoint2Point *this,btMultiBody *body,int link,btRigidBody *bodyB,
          btVector3 *pivotInA,btVector3 *pivotInB)

{
  undefined8 uVar1;
  float local_2c;
  
  btMultiBodyConstraint::btMultiBodyConstraint
            (&this->super_btMultiBodyConstraint,body,(btMultiBody *)0x0,link,-1,3,false);
  (this->super_btMultiBodyConstraint)._vptr_btMultiBodyConstraint =
       (_func_int **)&PTR__btMultiBodyPoint2Point_001f2198;
  this->m_rigidBodyA = (btRigidBody *)0x0;
  this->m_rigidBodyB = bodyB;
  uVar1 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_pivotInA).m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_pivotInA).m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(pivotInB->m_floats + 2);
  *(undefined8 *)(this->m_pivotInB).m_floats = *(undefined8 *)pivotInB->m_floats;
  *(undefined8 *)((this->m_pivotInB).m_floats + 2) = uVar1;
  local_2c = 0.0;
  btAlignedObjectArray<float>::resize(&(this->super_btMultiBodyConstraint).m_data,3,&local_2c);
  return;
}

Assistant:

btMultiBodyPoint2Point::btMultiBodyPoint2Point(btMultiBody* body, int link, btRigidBody* bodyB, const btVector3& pivotInA, const btVector3& pivotInB)
	:btMultiBodyConstraint(body,0,link,-1,BTMBP2PCONSTRAINT_DIM,false),
	m_rigidBodyA(0),
	m_rigidBodyB(bodyB),
	m_pivotInA(pivotInA),
	m_pivotInB(pivotInB)
{
    m_data.resize(BTMBP2PCONSTRAINT_DIM);//at least store the applied impulses
}